

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

CURLMcode cpool_update_shutdown_ev(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  CURLMcode CVar1;
  undefined1 auStack_40 [4];
  CURLMcode mresult;
  easy_pollset ps;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  ps._24_8_ = conn;
  memset(auStack_40,0,0x20);
  Curl_attach_connection(data,(connectdata *)ps._24_8_);
  Curl_conn_adjust_pollset(data,(easy_pollset *)auStack_40);
  Curl_detach_connection(data);
  CVar1 = Curl_multi_pollset_ev
                    (multi,data,(easy_pollset *)auStack_40,(easy_pollset *)(ps._24_8_ + 0x298));
  if (CVar1 == CURLM_OK) {
    *(undefined8 *)(ps._24_8_ + 0x298) = _auStack_40;
    *(undefined8 *)(ps._24_8_ + 0x2a0) = ps.sockets._0_8_;
    *(undefined8 *)(ps._24_8_ + 0x2a8) = ps.sockets._8_8_;
    *(undefined8 *)(ps._24_8_ + 0x2b0) = ps._16_8_;
  }
  return CVar1;
}

Assistant:

static CURLMcode cpool_update_shutdown_ev(struct Curl_multi *multi,
                                          struct Curl_easy *data,
                                          struct connectdata *conn)
{
  struct easy_pollset ps;
  CURLMcode mresult;

  DEBUGASSERT(data);
  DEBUGASSERT(multi);
  DEBUGASSERT(multi->socket_cb);

  memset(&ps, 0, sizeof(ps));
  Curl_attach_connection(data, conn);
  Curl_conn_adjust_pollset(data, &ps);
  Curl_detach_connection(data);

  mresult = Curl_multi_pollset_ev(multi, data, &ps, &conn->shutdown_poll);

  if(!mresult) /* Remember for next time */
    memcpy(&conn->shutdown_poll, &ps, sizeof(ps));
  return mresult;
}